

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void ParseCVarInfo(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FBaseCVar *pFVar4;
  ECVarType var_type;
  uint flags;
  UCVarValue val;
  char *pcVar5;
  FString cvarname;
  int lastlump;
  char *local_138;
  FScanner sc;
  
  lastlump = 0;
  local_138 = FString::NullString.Nothing;
  bVar2 = false;
  while (iVar3 = FWadCollection::FindLump(&Wads,"CVARINFO",&lastlump,false), iVar3 != -1) {
    FScanner::FScanner(&sc,iVar3);
    FScanner::SetCMode(&sc,true);
    while (bVar1 = FScanner::GetToken(&sc), bVar1) {
      cvarname.Chars = local_138;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      flags = 0x2001;
      while (pcVar5 = sc.String, sc.TokenType == 0x101) {
        iVar3 = strcasecmp(sc.String,"server");
        if (iVar3 == 0) {
          flags = flags | 4;
        }
        else {
          iVar3 = strcasecmp(pcVar5,"user");
          if (iVar3 == 0) {
            flags = flags | 2;
          }
          else {
            iVar3 = strcasecmp(pcVar5,"noarchive");
            if (iVar3 == 0) {
              flags = flags & 0xfffffffe;
            }
            else {
              FScanner::ScriptError(&sc,"Unknown cvar attribute \'%s\'",pcVar5);
            }
          }
        }
        FScanner::MustGetAnyToken(&sc);
      }
      if (((flags & 6) == 6) || ((flags & 6) == 0)) {
        FScanner::ScriptError(&sc,"One of \'server\' or \'user\' must be specified");
      }
      if (sc.TokenType == 0x132) {
        var_type = CVAR_Bool;
      }
      else if (sc.TokenType == 0x133) {
        var_type = CVAR_Float;
      }
      else if (sc.TokenType == 0x147) {
        var_type = CVAR_Color;
      }
      else if (sc.TokenType == 0x144) {
        var_type = CVAR_String;
      }
      else if (sc.TokenType == 0x13a) {
        var_type = CVAR_Int;
      }
      else {
        FScanner::ScriptError(&sc,"Bad cvar type \'%s\'",sc.String);
        var_type = CVAR_Dummy;
      }
      FScanner::MustGetToken(&sc,0x101);
      pFVar4 = FindCVar(sc.String,(FBaseCVar **)0x0);
      if (pFVar4 != (FBaseCVar *)0x0) {
        FScanner::ScriptError(&sc,"cvar \'%s\' already exists",sc.String);
      }
      FString::operator=(&cvarname,sc.String);
      bVar2 = FScanner::CheckToken(&sc,0x3d);
      if (bVar2) {
        if (var_type == CVAR_Float) {
          FScanner::MustGetFloat(&sc);
          pcVar5 = sc.String;
        }
        else if (var_type == CVAR_Int) {
          FScanner::MustGetNumber(&sc);
          pcVar5 = sc.String;
        }
        else if (var_type == CVAR_Bool) {
          bVar2 = FScanner::CheckToken(&sc,0x14b);
          pcVar5 = sc.String;
          if ((!bVar2) && (bVar2 = FScanner::CheckToken(&sc,0x14c), pcVar5 = sc.String, !bVar2)) {
            FScanner::ScriptError(&sc,"Expected true or false");
            pcVar5 = sc.String;
          }
        }
        else {
          FScanner::MustGetString(&sc);
          pcVar5 = sc.String;
        }
      }
      else {
        pcVar5 = (char *)0x0;
      }
      pFVar4 = C_CreateCVar(cvarname.Chars,var_type,flags);
      if (pcVar5 != (char *)0x0) {
        (*pFVar4->_vptr_FBaseCVar[8])(pFVar4,pcVar5,3);
      }
      FScanner::MustGetToken(&sc,0x3b);
      FString::~FString(&cvarname);
      bVar2 = true;
    }
    FScanner::~FScanner(&sc);
  }
  if (bVar2) {
    FGameConfigFile::DoModSetup(GameConfig,gameinfo.ConfigName.Chars);
  }
  return;
}

Assistant:

void ParseCVarInfo()
{
	int lump, lastlump = 0;
	bool addedcvars = false;

	while ((lump = Wads.FindLump("CVARINFO", &lastlump)) != -1)
	{
		FScanner sc(lump);
		sc.SetCMode(true);

		while (sc.GetToken())
		{
			FString cvarname;
			char *cvardefault = NULL;
			ECVarType cvartype = CVAR_Dummy;
			int cvarflags = CVAR_MOD|CVAR_ARCHIVE;
			FBaseCVar *cvar;

			// Check for flag tokens.
			while (sc.TokenType == TK_Identifier)
			{
				if (stricmp(sc.String, "server") == 0)
				{
					cvarflags |= CVAR_SERVERINFO;
				}
				else if (stricmp(sc.String, "user") == 0)
				{
					cvarflags |= CVAR_USERINFO;
				}
				else if (stricmp(sc.String, "noarchive") == 0)
				{
					cvarflags &= ~CVAR_ARCHIVE;
				}
				else
				{
					sc.ScriptError("Unknown cvar attribute '%s'", sc.String);
				}
				sc.MustGetAnyToken();
			}
			// Do some sanity checks.
			if ((cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == 0 ||
				(cvarflags & (CVAR_SERVERINFO|CVAR_USERINFO)) == (CVAR_SERVERINFO|CVAR_USERINFO))
			{
				sc.ScriptError("One of 'server' or 'user' must be specified");
			}
			// The next token must be the cvar type.
			if (sc.TokenType == TK_Bool)
			{
				cvartype = CVAR_Bool;
			}
			else if (sc.TokenType == TK_Int)
			{
				cvartype = CVAR_Int;
			}
			else if (sc.TokenType == TK_Float)
			{
				cvartype = CVAR_Float;
			}
			else if (sc.TokenType == TK_Color)
			{
				cvartype = CVAR_Color;
			}
			else if (sc.TokenType == TK_String)
			{
				cvartype = CVAR_String;
			}
			else
			{
				sc.ScriptError("Bad cvar type '%s'", sc.String);
			}
			// The next token must be the cvar name.
			sc.MustGetToken(TK_Identifier);
			if (FindCVar(sc.String, NULL) != NULL)
			{
				sc.ScriptError("cvar '%s' already exists", sc.String);
			}
			cvarname = sc.String;
			// A default value is optional and signalled by a '=' token.
			if (sc.CheckToken('='))
			{
				switch (cvartype)
				{
				case CVAR_Bool:
					if (!sc.CheckToken(TK_True) && !sc.CheckToken(TK_False))
					{
						sc.ScriptError("Expected true or false");
					}
					cvardefault = sc.String;
					break;
				case CVAR_Int:
					sc.MustGetNumber();
					cvardefault = sc.String;
					break;
				case CVAR_Float:
					sc.MustGetFloat();
					cvardefault = sc.String;
					break;
				default:
					sc.MustGetString();
					cvardefault = sc.String;
					break;
				}
			}
			// Now create the cvar.
			cvar = C_CreateCVar(cvarname, cvartype, cvarflags);
			if (cvardefault != NULL)
			{
				UCVarValue val;
				val.String = cvardefault;
				cvar->SetGenericRepDefault(val, CVAR_String);
			}
			// To be like C and ACS, require a semicolon after everything.
			sc.MustGetToken(';');
			addedcvars = true;
		}
	}
	// Only load mod cvars from the config if we defined some, so we don't
	// clutter up the cvar space when not playing mods with custom cvars.
	if (addedcvars)
	{
		GameConfig->DoModSetup (gameinfo.ConfigName);
	}
}